

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_queue.c
# Opt level: O2

void priority_queue_free(priority_queue_t *queue,_func_void_void_ptr *free_ptr)

{
  void *ptr;
  size_t i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < queue->alloc_size; uVar1 = uVar1 + 1) {
    ptr = queue->pointers[uVar1];
    if (ptr != (void *)0x0) {
      if (free_ptr == (_func_void_void_ptr *)0x0) {
        ckd_free(ptr);
      }
      else {
        (*free_ptr)(ptr);
      }
    }
  }
  ckd_free(queue->pointers);
  ckd_free(queue);
  return;
}

Assistant:

void priority_queue_free(priority_queue_t *queue, void (*free_ptr)(void *a))
{
    size_t i;

    for (i = 0; i < queue->alloc_size; i++) {
        if (queue->pointers[i] != NULL) {
            if (free_ptr == NULL) {
                ckd_free(queue->pointers[i]);
            } else {
                free_ptr(queue->pointers[i]);
            }
        }
    }
    ckd_free(queue->pointers);
    ckd_free(queue);
}